

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_vector.h
# Opt level: O0

void ipx::
     for_each_nonzero<ipx::Crossover::PushDual(ipx::Basis*,std::valarray<double>&,std::valarray<double>&,std::vector<int,std::allocator<int>>const&,int_const*,ipx::Info*)::__0>
               (IndexedVector *v,anon_class_16_2_d707e3aa *c)

{
  bool bVar1;
  Int IVar2;
  IndexedVector *in_RSI;
  IndexedVector *in_RDI;
  Int ii;
  Int i_1;
  Int dim;
  Int i;
  Int p;
  Int nnz;
  Int *pattern;
  Int in_stack_ffffffffffffffac;
  IndexedVector *in_stack_ffffffffffffffb0;
  IndexedVector *pIVar3;
  Int in_stack_ffffffffffffffbc;
  int i_00;
  IndexedVector *in_stack_ffffffffffffffc0;
  undefined4 local_2c;
  undefined4 local_20;
  
  bVar1 = IndexedVector::sparse(in_stack_ffffffffffffffc0);
  if (bVar1) {
    IndexedVector::pattern((IndexedVector *)0x81953b);
    IVar2 = IndexedVector::nnz(in_RDI);
    for (local_20 = 0; local_20 < IVar2; local_20 = local_20 + 1) {
      pIVar3 = in_RSI;
      IndexedVector::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      Crossover::PushDual::anon_class_16_2_d707e3aa::operator()
                ((anon_class_16_2_d707e3aa *)pIVar3,in_stack_ffffffffffffffbc,
                 (double)in_stack_ffffffffffffffb0);
    }
  }
  else {
    IVar2 = IndexedVector::dim((IndexedVector *)0x8195bc);
    for (local_2c = 0; local_2c < IVar2; local_2c = local_2c + 1) {
      pIVar3 = in_RSI;
      i_00 = local_2c;
      IndexedVector::operator[](in_RSI,in_stack_ffffffffffffffac);
      Crossover::PushDual::anon_class_16_2_d707e3aa::operator()
                ((anon_class_16_2_d707e3aa *)in_stack_ffffffffffffffc0,i_00,(double)pIVar3);
    }
  }
  return;
}

Assistant:

void for_each_nonzero(IndexedVector& v, C& c) {
    if (v.sparse()) {
        const Int* pattern = v.pattern();
        Int nnz = v.nnz();
        for (Int p = 0; p < nnz; p++) {
            const Int i = pattern[p];
            c(i, v[i]);
        }
    } else {
        Int dim = v.dim();
        for (Int i = 0; i < dim; i++) {
            const Int ii = i;   // make sure that caller does not change i
            c(ii, v[i]);
        }
    }
}